

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O3

void __thiscall
capnp::EzRpcClient::Impl::Impl
          (Impl *this,sockaddr *serverAddress,uint addrSize,ReaderOptions readerOpts)

{
  NetworkAddress *pNVar1;
  undefined8 uVar2;
  PromiseNode *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  Own<kj::NetworkAddress> local_88;
  undefined1 local_78 [24];
  PromiseNode *pPStack_60;
  Own<kj::_::PromiseNode> local_58;
  Impl *local_40;
  uint64_t local_38;
  int local_30;
  
  EzRpcContext::getThreadLocal();
  iVar4 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 8))
            (&local_88,(long *)CONCAT44(extraout_var,iVar4),serverAddress,addrSize);
  connectAttach((capnp *)local_78,&local_88);
  local_30 = readerOpts.nestingLimit;
  local_40 = this;
  local_38 = readerOpts.traversalLimitInWords;
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::AsyncIoStream>,capnp::EzRpcClient::Impl::Impl(sockaddr_const*,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::AsyncIoStream>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::EzRpcClient::Impl::Impl(sockaddr_const*,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::AsyncIoStream>&&)_1_,kj::_::PropagateException>
            (&local_58,(anon_class_24_2_846dc7fe_for_func *)local_78,(PropagateException *)&local_40
            );
  local_78._16_8_ = local_58.disposer;
  pPStack_60 = local_58.ptr;
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  pPVar3 = pPStack_60;
  if (pPStack_60 != (PromiseNode *)0x0) {
    pPStack_60 = (PromiseNode *)0x0;
    (***(_func_int ***)local_78._16_8_)
              (local_78._16_8_,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  uVar2 = local_78._8_8_;
  if ((long *)local_78._8_8_ != (long *)0x0) {
    local_78._8_8_ = (long *)0x0;
    (*(code *)((Own<capnp::EzRpcContext> *)local_78._0_8_)->disposer->_vptr_Disposer)
              (local_78._0_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
  }
  pNVar1 = local_88.ptr;
  if (local_88.ptr != (NetworkAddress *)0x0) {
    local_88.ptr = (NetworkAddress *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               pNVar1->_vptr_NetworkAddress[-2] + (long)&pNVar1->_vptr_NetworkAddress);
  }
  (this->clientContext).ptr.disposer = (Disposer *)0x0;
  (this->clientContext).ptr.ptr = (ClientContext *)0x0;
  return;
}

Assistant:

Impl(const struct sockaddr* serverAddress, uint addrSize,
       ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(
            connectAttach(context->getIoProvider().getNetwork()
                .getSockaddr(serverAddress, addrSize))
            .then([this, readerOpts](kj::Own<kj::AsyncIoStream>&& stream) {
              clientContext = kj::heap<ClientContext>(kj::mv(stream),
                                                      readerOpts);
            }).fork()) {}